

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_dependency.cpp
# Opt level: O2

LogicalDependencyList *
duckdb::LogicalDependencyList::Deserialize
          (LogicalDependencyList *__return_storage_ptr__,Deserializer *deserializer)

{
  (__return_storage_ptr__->set)._M_h._M_buckets =
       &(__return_storage_ptr__->set)._M_h._M_single_bucket;
  (__return_storage_ptr__->set)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->set)._M_h._M_element_count = 0;
  (__return_storage_ptr__->set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->set)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Deserializer::
  ReadProperty<std::unordered_set<duckdb::LogicalDependency,duckdb::LogicalDependencyHashFunction,duckdb::LogicalDependencyEquality,std::allocator<duckdb::LogicalDependency>>>
            (deserializer,100,"set",&__return_storage_ptr__->set);
  return __return_storage_ptr__;
}

Assistant:

LogicalDependencyList LogicalDependencyList::Deserialize(Deserializer &deserializer) {
	LogicalDependencyList result;
	deserializer.ReadProperty<create_info_set_t>(100, "set", result.set);
	return result;
}